

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O2

Interpolation
deqp::gles31::Functional::anon_unknown_0::getGluInterpolation(VaryingInterpolation interpolation)

{
  Interpolation IVar1;
  
  IVar1 = INTERPOLATION_LAST;
  if (interpolation < VARYINGINTERPOLATION_DEFAULT) {
    IVar1 = interpolation;
  }
  return IVar1;
}

Assistant:

glu::Interpolation getGluInterpolation (VaryingInterpolation interpolation)
{
	switch (interpolation)
	{
		case VARYINGINTERPOLATION_SMOOTH:	return glu::INTERPOLATION_SMOOTH;
		case VARYINGINTERPOLATION_FLAT:		return glu::INTERPOLATION_FLAT;
		case VARYINGINTERPOLATION_CENTROID:	return glu::INTERPOLATION_CENTROID;
		case VARYINGINTERPOLATION_DEFAULT:	return glu::INTERPOLATION_LAST;		//!< Last means no qualifier, i.e. default
		default:
			DE_FATAL("Invalid interpolation");
			return glu::INTERPOLATION_LAST;
	}
}